

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(int argc,char **argv)

{
  char *str;
  size_t sVar1;
  long lVar2;
  
  for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 8) {
    str = *(char **)((long)&PTR_anon_var_dwarf_27_00103df0 + lVar2);
    sVar1 = my_strlen(str);
    printf("\'%s\' is %zu characters long.\n",str,sVar1);
  }
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  char* strings[1024] = {
    "bread",
    "The night sky is bright.",
    "Are we there yet?",
    "🐺"
  };

  for (size_t n = 0; n < 4; n++) {
    printf("'%s' is %zu characters long.\n", strings[n], my_strlen(strings[n]));
  }

  return 0;
}